

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IfConversion::HoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  BasicBlock *this_00;
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  Instruction *pIVar4;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  Instruction *local_80;
  Instruction *insertion_pos;
  BasicBlock *local_70;
  DefUseManager *local_68;
  BasicBlock *local_60;
  function<void_(unsigned_int_*)> local_58;
  DefUseManager *local_38;
  DefUseManager *def_use_mgr;
  BasicBlock *inst_block;
  DominatorAnalysis *dominators_local;
  BasicBlock *target_block_local;
  Instruction *inst_local;
  IfConversion *this_local;
  
  inst_block = (BasicBlock *)dominators;
  dominators_local = (DominatorAnalysis *)target_block;
  target_block_local = (BasicBlock *)inst;
  inst_local = (Instruction *)this;
  pIVar3 = Pass::context(&this->super_Pass);
  def_use_mgr = (DefUseManager *)
                IRContext::get_instr_block(pIVar3,(Instruction *)target_block_local);
  if ((def_use_mgr != (DefUseManager *)0x0) &&
     (bVar1 = DominatorAnalysisBase::Dominates
                        ((DominatorAnalysisBase *)inst_block,(BasicBlock *)def_use_mgr,
                         (BasicBlock *)dominators_local), !bVar1)) {
    bVar1 = Instruction::IsOpcodeCodeMotionSafe((Instruction *)target_block_local);
    if (!bVar1) {
      __assert_fail("inst->IsOpcodeCodeMotionSafe() && \"Trying to move an instruction that is not safe to move.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp"
                    ,0xfa,
                    "void spvtools::opt::IfConversion::HoistInstruction(Instruction *, BasicBlock *, DominatorAnalysis *)"
                   );
    }
    pIVar3 = Pass::context(&this->super_Pass);
    local_68 = IRContext::get_def_use_mgr(pIVar3);
    this_00 = target_block_local;
    local_70 = (BasicBlock *)dominators_local;
    local_60 = inst_block;
    insertion_pos = (Instruction *)this;
    local_38 = local_68;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::IfConversion::HoistInstruction(spvtools::opt::Instruction*,spvtools::opt::BasicBlock*,spvtools::opt::DominatorAnalysis*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_58,(anon_class_32_4_49755fc2 *)&insertion_pos
              );
    Instruction::ForEachInId((Instruction *)this_00,&local_58);
    std::function<void_(unsigned_int_*)>::~function(&local_58);
    local_80 = BasicBlock::terminator((BasicBlock *)dominators_local);
    pIVar4 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                       (&local_80->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    OVar2 = Instruction::opcode(pIVar4);
    if (OVar2 == OpSelectionMerge) {
      local_80 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                           (&local_80->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)target_block_local);
    pIVar4 = local_80;
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_88,(pointer)target_block_local);
    Instruction::InsertBefore(pIVar4,&local_88);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_88);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::set_instr_block
              (pIVar3,(Instruction *)target_block_local,(BasicBlock *)dominators_local);
  }
  return;
}

Assistant:

void IfConversion::HoistInstruction(Instruction* inst, BasicBlock* target_block,
                                    DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return;
  }

  assert(inst->IsOpcodeCodeMotionSafe() &&
         "Trying to move an instruction that is not safe to move.");

  // First hoist all instructions it depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  inst->ForEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        HoistInstruction(operand_inst, target_block, dominators);
      });

  Instruction* insertion_pos = target_block->terminator();
  if ((insertion_pos)->PreviousNode()->opcode() == spv::Op::OpSelectionMerge) {
    insertion_pos = insertion_pos->PreviousNode();
  }
  inst->RemoveFromList();
  insertion_pos->InsertBefore(std::unique_ptr<Instruction>(inst));
  context()->set_instr_block(inst, target_block);
}